

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterial_metal(SemanticParser *this,SP *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  runtime_error *this_00;
  long *plVar7;
  element_type *peVar8;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Base_ptr this_01;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  float fVar12;
  undefined1 auVar13 [16];
  SP SVar14;
  SP mat;
  size_t N;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  MetalMaterial *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  SP *local_f0;
  SemanticParser *local_e8;
  string local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_c0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_128 = (MetalMaterial *)0x0;
  local_f0 = in;
  local_e8 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::MetalMaterial,std::allocator<pbrt::MetalMaterial>,std::__cxx11::string&>
            (&_Stack_120,&local_128,(allocator<pbrt::MetalMaterial> *)&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  std::__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::MetalMaterial,pbrt::MetalMaterial>
            ((__shared_ptr<pbrt::MetalMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_128,local_128);
  p_Var10 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var11 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var9._M_pi = extraout_RDX;
  if (p_Var10 != p_Var11) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_c0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var10 + 1));
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_c0.first._M_dataplus._M_p,
                 local_c0.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_c0.first._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar5 == 0) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_e0);
        if (bVar4) {
          syntactic::ParamSet::getParamTexture((ParamSet *)local_60,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
          uVar3 = local_118._8_8_;
          uVar2 = local_118._0_8_;
          local_118._0_8_ = (element_type *)0x0;
          local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var1 = (((SP *)&local_128->map_roughness)->
                   super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (((SP *)&local_128->map_roughness)->
          super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)uVar2;
          (((SP *)&local_128->map_roughness)->
          super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          this_01 = (_Base_ptr)local_60._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            this_01 = (_Base_ptr)local_60._8_8_;
          }
LAB_00142192:
          if (this_01 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          }
        }
        else {
          fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_e0,0.0);
          *(float *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128->roughness)->_M_pi =
               fVar12;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar5 == 0) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_e0);
          if (bVar4) {
            syntactic::ParamSet::getParamTexture((ParamSet *)local_70,(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
            uVar3 = local_118._8_8_;
            uVar2 = local_118._0_8_;
            local_118._0_8_ = (element_type *)0x0;
            local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var1 = (local_128->map_uRoughness).
                     super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ;
            (local_128->map_uRoughness).
            super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar2;
            (local_128->map_uRoughness).
            super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            this_01 = (_Base_ptr)local_70._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              this_01 = (_Base_ptr)local_70._8_8_;
            }
            goto LAB_00142192;
          }
          fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_e0,0.0);
          *(float *)&(((SP *)&local_128->uRoughness)->
                     super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               fVar12;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar5 == 0) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_e0);
            if (bVar4) {
              syntactic::ParamSet::getParamTexture((ParamSet *)local_80,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
              uVar3 = local_118._8_8_;
              uVar2 = local_118._0_8_;
              local_118._0_8_ = (element_type *)0x0;
              local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var1 = (((SP *)&local_128->map_vRoughness)->
                       super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
              (((SP *)&local_128->map_vRoughness)->
              super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)uVar2;
              (((SP *)&local_128->map_vRoughness)->
              super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              this_01 = (_Base_ptr)local_80._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                this_01 = (_Base_ptr)local_80._8_8_;
              }
              goto LAB_00142192;
            }
            fVar12 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_e0,0.0);
            *(float *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128->vRoughness)->_M_pi
                 = fVar12;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_e0);
            if (iVar5 == 0) {
              bVar4 = syntactic::ParamSet::getParamBool((ParamSet *)*in_RDX,&local_e0,false);
              local_128->remapRoughness = bVar4;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_e0);
              if (iVar5 == 0) {
                bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&local_e0);
                if (bVar4) {
                  lVar6 = 0x84;
LAB_001420c9:
                  syntactic::ParamSet::getParam3f
                            ((ParamSet *)*in_RDX,
                             (float *)((long)&(local_128->super_Material).super_Entity._vptr_Entity
                                      + lVar6),&local_e0);
                }
                else {
                  local_118._0_8_ = (element_type *)0x0;
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,(value_type *)0x0,(size_t *)local_118,&local_e0);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  resize(&(local_128->spectrum_eta).spd,local_118._0_8_);
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,
                             (local_128->spectrum_eta).spd.
                             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_118,&local_e0
                            );
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_e0);
                if (iVar5 == 0) {
                  bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&local_e0);
                  if (bVar4) {
                    lVar6 = 0xc0;
                    goto LAB_001420c9;
                  }
                  local_118._0_8_ = (element_type *)0x0;
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,(value_type *)0x0,(size_t *)local_118,&local_e0);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  resize(&(local_128->spectrum_k).spd,local_118._0_8_);
                  syntactic::ParamSet::getParamPairNf
                            ((ParamSet *)*in_RDX,
                             (local_128->spectrum_k).spd.
                             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_118,&local_e0
                            );
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
                  if (iVar5 == 0) {
                    syntactic::ParamSet::getParamTexture((ParamSet *)local_90,(string *)*in_RDX);
                    findOrCreateTexture((SemanticParser *)local_118,(SP *)local_f0);
                    uVar3 = local_118._8_8_;
                    uVar2 = local_118._0_8_;
                    local_118._0_8_ = (element_type *)0x0;
                    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var1 = (local_128->map_bump).
                             super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    (local_128->map_bump).
                    super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)uVar2;
                    (local_128->map_bump).
                    super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
                    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                    }
                    this_01 = (_Base_ptr)local_90._8_8_;
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                      this_01 = (_Base_ptr)local_90._8_8_;
                    }
                    goto LAB_00142192;
                  }
                  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
                  if (iVar5 != 0) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+(&local_50,"un-handled metal-material parameter \'",
                                   &local_c0.first);
                    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_118._0_8_ = *plVar7;
                    peVar8 = (element_type *)(plVar7 + 2);
                    if ((element_type *)local_118._0_8_ == peVar8) {
                      local_118._16_8_ = (peVar8->super_Entity)._vptr_Entity;
                      _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
                      local_118._0_8_ = (element_type *)(local_118 + 0x10);
                    }
                    else {
                      local_118._16_8_ = (peVar8->super_Entity)._vptr_Entity;
                    }
                    local_118._8_8_ = plVar7[1];
                    *plVar7 = (long)peVar8;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    std::runtime_error::runtime_error(this_00,(string *)local_118);
                    __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_c0.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
      auVar13 = std::_Rb_tree_increment(p_Var10);
      _Var9._M_pi = auVar13._8_8_;
      p_Var10 = auVar13._0_8_;
    } while (p_Var10 != p_Var11);
  }
  (local_e8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_e8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  (local_e8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_120._M_pi;
  SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e8;
  return (SP)SVar14.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_metal(pbrt::syntactic::Material::SP in)
  {
    MetalMaterial::SP mat = std::make_shared<MetalMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->roughness = in->getParam1f(name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name))
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name))
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "eta") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->eta.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_eta.spd.resize(N);
          in->getParamPairNf(mat->spectrum_eta.spd.data(),&N,name);
        }
      }
      else if (name == "k") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->k.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_k.spd.resize(N);
          in->getParamPairNf(mat->spectrum_k.spd.data(),&N,name);
        }
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled metal-material parameter '"+it.first+"'");
    };
    return mat;
  }